

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::GetDirectBufferPointer
          (CodedInputStream *this,void **data,int *size)

{
  bool bVar1;
  
  if ((*(int *)&this->buffer_end_ == *(int *)&this->buffer_) && (bVar1 = Refresh(this), !bVar1)) {
    return false;
  }
  *data = this->buffer_;
  *size = *(int *)&this->buffer_end_ - *(int *)&this->buffer_;
  return true;
}

Assistant:

bool CodedInputStream::GetDirectBufferPointer(const void** data, int* size) {
  if (BufferSize() == 0 && !Refresh()) return false;

  *data = buffer_;
  *size = BufferSize();
  return true;
}